

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxDynamicCast::Resolve(FxDynamicCast *this,FCompileContext *ctx)

{
  FxExpression *x;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxTypeCast *this_00;
  PPointer *pPVar3;
  undefined4 extraout_var_00;
  PClass *size;
  byte local_41;
  bool constflag;
  int a;
  FCompileContext *ctx_local;
  FxDynamicCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->expr != (FxExpression *)0x0) {
      iVar2 = (*this->expr->_vptr_FxExpression[2])(this->expr,ctx);
      this->expr = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->expr == (FxExpression *)0x0) {
      if (this != (FxDynamicCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxDynamicCast *)0x0;
    }
    else {
      size = PPointer::RegistrationInfo.MyClass;
      bVar1 = DObject::IsKindOf((DObject *)this->expr->ValueType,PPointer::RegistrationInfo.MyClass)
      ;
      local_41 = 0;
      if (bVar1) {
        local_41 = *(byte *)&this->expr->ValueType[1].super_PTypeBase.super_DObject.Class;
      }
      if ((local_41 & 1) == 0) {
        this_00 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        x = this->expr;
        pPVar3 = NewPointer((PType *)DObject::RegistrationInfo.MyClass,false);
        FxTypeCast::FxTypeCast(this_00,x,(PType *)pPVar3,true,true);
        this->expr = (FxExpression *)this_00;
        iVar2 = (*this->expr->_vptr_FxExpression[2])(this->expr,ctx);
        this->expr = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        if (this->expr == (FxExpression *)0x0) {
          if (this != (FxDynamicCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxDynamicCast *)0x0;
        }
        else {
          pPVar3 = NewPointer((PType *)this->CastType,false);
          (this->super_FxExpression).ValueType = (PType *)pPVar3;
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot cast a readonly pointer");
        if (this != (FxDynamicCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxDynamicCast *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxDynamicCast::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(expr, ctx);
	if (expr->ExprType == EFX_GetDefaultByType)
	{
		int a = 0;
	}
	bool constflag = expr->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer *>(expr->ValueType)->IsConst;
	if (constflag)
	{
		// readonly pointers are normally only used for class defaults which lack type information to be cast properly, so we have to error out here.
		ScriptPosition.Message(MSG_ERROR, "Cannot cast a readonly pointer");
		delete this;
		return nullptr;
	}
	expr = new FxTypeCast(expr, NewPointer(RUNTIME_CLASS(DObject), constflag), true, true);
	expr = expr->Resolve(ctx);
	if (expr == nullptr)
	{
		delete this;
		return nullptr;
	}
	ValueType = NewPointer(CastType, constflag);
	return this;
}